

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O0

QRect __thiscall QWidgetItem::geometry(QWidgetItem *this)

{
  long lVar1;
  bool bVar2;
  QRect *pQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QRect *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  WidgetAttribute in_stack_ffffffffffffffc4;
  QWidget *in_stack_ffffffffffffffc8;
  undefined1 local_18 [16];
  undefined1 auVar5 [12];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWidget::testAttribute(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  if (bVar2) {
    pQVar3 = QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
    local_18 = *(undefined1 (*) [16])pQVar3;
  }
  else {
    QWidget::d_func((QWidget *)0x3458f5);
    QWidget::geometry(*(QWidget **)(in_RDI + 0x10));
    local_18 = (undefined1  [16])
               toLayoutItemRect((QWidgetPrivate *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar4.x1.m_i = local_18._0_4_;
    auVar5._4_4_ = local_18._4_4_;
    QVar4.x2.m_i = local_18._8_4_;
    QVar4.y2.m_i = local_18._12_4_;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QRect QWidgetItem::geometry() const
{
    return !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
           ? toLayoutItemRect(wid->d_func(), wid->geometry())
           : wid->geometry();
}